

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int readSuperJournal(sqlite3_file *pJrnl,char *zSuper,u32 nSuper)

{
  long local_48;
  uchar aMagic [8];
  u32 u;
  u32 cksum;
  i64 szJ;
  int local_28;
  u32 len;
  int rc;
  u32 nSuper_local;
  char *zSuper_local;
  sqlite3_file *pJrnl_local;
  
  *zSuper = '\0';
  len = nSuper;
  _rc = zSuper;
  zSuper_local = (char *)pJrnl;
  local_28 = sqlite3OsFileSize(pJrnl,(i64 *)&u);
  if ((((((local_28 == 0) && (0xf < _u)) &&
        (local_28 = read32bits((sqlite3_file *)zSuper_local,_u + -0x10,(u32 *)((long)&szJ + 4)),
        local_28 == 0)) && ((szJ._4_4_ < len && ((long)(ulong)szJ._4_4_ <= _u + -0x10)))) &&
      ((szJ._4_4_ != 0 &&
       ((local_28 = read32bits((sqlite3_file *)zSuper_local,_u + -0xc,(u32 *)(aMagic + 4)),
        local_28 == 0 &&
        (local_28 = sqlite3OsRead((sqlite3_file *)zSuper_local,&local_48,8,_u + -8), local_28 == 0))
       )))) && ((local_48 == -0x289c5edf06fa2a27 &&
                (local_28 = sqlite3OsRead((sqlite3_file *)zSuper_local,_rc,szJ._4_4_,
                                          (_u + -0x10) - (ulong)szJ._4_4_), local_28 == 0)))) {
    aMagic[0] = '\0';
    aMagic[1] = '\0';
    aMagic[2] = '\0';
    aMagic[3] = '\0';
    for (; (uint)aMagic._0_4_ < szJ._4_4_; aMagic._0_4_ = aMagic._0_4_ + 1) {
      aMagic._4_4_ = aMagic._4_4_ - (int)_rc[(uint)aMagic._0_4_];
    }
    if (aMagic._4_4_ != 0) {
      szJ._4_4_ = 0;
    }
    _rc[szJ._4_4_] = '\0';
    _rc[szJ._4_4_ + 1] = '\0';
    return 0;
  }
  return local_28;
}

Assistant:

static int readSuperJournal(sqlite3_file *pJrnl, char *zSuper, u32 nSuper){
  int rc;                    /* Return code */
  u32 len;                   /* Length in bytes of super-journal name */
  i64 szJ;                   /* Total size in bytes of journal file pJrnl */
  u32 cksum;                 /* MJ checksum value read from journal */
  u32 u;                     /* Unsigned loop counter */
  unsigned char aMagic[8];   /* A buffer to hold the magic header */
  zSuper[0] = '\0';

  if( SQLITE_OK!=(rc = sqlite3OsFileSize(pJrnl, &szJ))
   || szJ<16
   || SQLITE_OK!=(rc = read32bits(pJrnl, szJ-16, &len))
   || len>=nSuper
   || len>szJ-16
   || len==0
   || SQLITE_OK!=(rc = read32bits(pJrnl, szJ-12, &cksum))
   || SQLITE_OK!=(rc = sqlite3OsRead(pJrnl, aMagic, 8, szJ-8))
   || memcmp(aMagic, aJournalMagic, 8)
   || SQLITE_OK!=(rc = sqlite3OsRead(pJrnl, zSuper, len, szJ-16-len))
  ){
    return rc;
  }

  /* See if the checksum matches the super-journal name */
  for(u=0; u<len; u++){
    cksum -= zSuper[u];
  }
  if( cksum ){
    /* If the checksum doesn't add up, then one or more of the disk sectors
    ** containing the super-journal filename is corrupted. This means
    ** definitely roll back, so just return SQLITE_OK and report a (nul)
    ** super-journal filename.
    */
    len = 0;
  }
  zSuper[len] = '\0';
  zSuper[len+1] = '\0';

  return SQLITE_OK;
}